

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPage::setTitle(QWizardPage *this,QString *title)

{
  QWizardPagePrivate *pQVar1;
  QWizard *pQVar2;
  QString *in_RSI;
  QWizard *in_RDI;
  QWizardPagePrivate *d;
  QWizardPrivate *in_stack_00000040;
  
  pQVar1 = d_func((QWizardPage *)0x7bcbf1);
  QString::operator=(&pQVar1->title,in_RSI);
  if (pQVar1->wizard != (QWizard *)0x0) {
    pQVar2 = (QWizard *)QWizard::currentPage(in_RDI);
    if (pQVar2 == in_RDI) {
      QWizard::d_func((QWizard *)0x7bcc47);
      QWizardPrivate::updateLayout(in_stack_00000040);
    }
  }
  return;
}

Assistant:

void QWizardPage::setTitle(const QString &title)
{
    Q_D(QWizardPage);
    d->title = title;
    if (d->wizard && d->wizard->currentPage() == this)
        d->wizard->d_func()->updateLayout();
}